

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

Statement *
slang::ast::WaitOrderStatement::fromSyntax
          (Compilation *compilation,WaitOrderStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  Type *this;
  ActionBlockSyntax *pAVar1;
  ElseClauseSyntax *pEVar2;
  WaitOrderStatementSyntax *this_00;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  SyntaxNode *pSVar6;
  WaitOrderStatement *this_01;
  undefined4 extraout_var_00;
  StatementSyntax *pSVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  socklen_t __len;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  ASTContext *extraout_RDX_02;
  ASTContext *extraout_RDX_03;
  ASTContext *src;
  char *func;
  size_t index;
  WaitOrderStatement *unaff_R13;
  bool bVar8;
  SourceRange SVar9;
  Statement *ifFalse;
  Statement *ifTrue;
  SmallVector<const_slang::ast::Expression_*,_5UL> events;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_c0;
  Statement *local_b0;
  Statement *local_a8;
  StatementContext *local_a0;
  WaitOrderStatementSyntax *local_98;
  ulong local_90;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *local_88;
  SmallVectorBase<const_slang::ast::Expression_*> local_80 [2];
  SourceRange local_40;
  undefined4 extraout_var;
  
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  uVar5 = (syntax->names).elements.size_ + 1;
  bVar8 = uVar5 < 2;
  src = context;
  local_a0 = stmtCtx;
  local_98 = syntax;
  if (!bVar8) {
    local_88 = &syntax->names;
    local_90 = uVar5 >> 1;
    index = 0;
    do {
      pSVar6 = (SyntaxNode *)
               slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::operator[]
                         (local_88,index);
      iVar4 = Expression::bind((int)pSVar6,(sockaddr *)context,0);
      this_01 = (WaitOrderStatement *)CONCAT44(extraout_var,iVar4);
      bVar3 = Expression::bad((Expression *)this_01);
      if (bVar3) {
        local_c0.data_ = (pointer)0x0;
        unaff_R13 = (WaitOrderStatement *)
                    BumpAllocator::
                    emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                              (&compilation->super_BumpAllocator,(Statement **)&local_c0);
        src = extraout_RDX;
LAB_0027b069:
        bVar3 = false;
      }
      else {
        this = ((not_null<const_slang::ast::Type_*> *)&(this_01->super_Statement).syntax)->ptr;
        if (this == (Type *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                    );
        }
        if (this->canonical == (Type *)0x0) {
          Type::resolveCanonical(this);
        }
        if ((this->canonical->super_Symbol).kind != EventType) {
          SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar6);
          ASTContext::addDiag(context,(DiagCode)0x2c0008,SVar9);
          local_c0.data_ = (pointer)0x0;
          unaff_R13 = (WaitOrderStatement *)
                      BumpAllocator::
                      emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                                (&compilation->super_BumpAllocator,(Statement **)&local_c0);
          src = extraout_RDX_01;
          goto LAB_0027b069;
        }
        local_c0.data_ = (pointer)this_01;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_80,
                   (Expression **)&local_c0);
        bVar3 = true;
        src = extraout_RDX_00;
      }
      if (!bVar3) break;
      index = index + 1;
      bVar8 = local_90 == index;
    } while (!bVar8);
  }
  this_00 = local_98;
  if (!bVar8) {
LAB_0027b1b7:
    if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
      free(local_80[0].data_);
    }
    return &unaff_R13->super_Statement;
  }
  local_a8 = (Statement *)0x0;
  local_b0 = (Statement *)0x0;
  pAVar1 = (local_98->action).ptr;
  func = 
  "T slang::not_null<slang::syntax::ActionBlockSyntax *>::get() const [T = slang::syntax::ActionBlockSyntax *]"
  ;
  if (pAVar1 != (ActionBlockSyntax *)0x0) {
    pSVar7 = pAVar1->statement;
    __len = (socklen_t)local_a0;
    if (pSVar7 != (StatementSyntax *)0x0) {
      iVar4 = Statement::bind((int)pSVar7,(sockaddr *)context,__len);
      local_a8 = (Statement *)CONCAT44(extraout_var_00,iVar4);
      src = extraout_RDX_02;
    }
    pAVar1 = (this_00->action).ptr;
    if (pAVar1 != (ActionBlockSyntax *)0x0) {
      pEVar2 = pAVar1->elseClause;
      if (pEVar2 != (ElseClauseSyntax *)0x0) {
        pSVar6 = (pEVar2->clause).ptr;
        if (pSVar6 == (SyntaxNode *)0x0) {
          func = 
          "T slang::not_null<slang::syntax::SyntaxNode *>::get() const [T = slang::syntax::SyntaxNode *]"
          ;
          goto LAB_0027b206;
        }
        pSVar7 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(pSVar6);
        iVar4 = Statement::bind((int)pSVar7,(sockaddr *)context,__len);
        local_b0 = (Statement *)CONCAT44(extraout_var_01,iVar4);
        src = extraout_RDX_03;
      }
      iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (local_80,(EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)src);
      local_c0.data_ = (pointer)CONCAT44(extraout_var_02,iVar4);
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
      unaff_R13 = BumpAllocator::
                  emplace<slang::ast::WaitOrderStatement,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
                            (&compilation->super_BumpAllocator,&local_c0,&local_a8,&local_b0,
                             &local_40);
      if ((((context->flags).m_bits & 0x6000) != 0) ||
         (bVar8 = ASTContext::inAlwaysCombLatch(context), bVar8)) {
        SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
        ASTContext::addDiag(context,(DiagCode)0x460008,SVar9);
        local_c0.data_ = (pointer)unaff_R13;
        unaff_R13 = (WaitOrderStatement *)
                    BumpAllocator::
                    emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                              (&compilation->super_BumpAllocator,(Statement **)&local_c0);
      }
      goto LAB_0027b1b7;
    }
  }
LAB_0027b206:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Statement& WaitOrderStatement::fromSyntax(Compilation& compilation,
                                          const WaitOrderStatementSyntax& syntax,
                                          const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> events;
    for (auto name : syntax.names) {
        auto& ev = Expression::bind(*name, context);
        if (ev.bad())
            return badStmt(compilation, nullptr);

        if (!ev.type->isEvent()) {
            context.addDiag(diag::NotAnEvent, name->sourceRange());
            return badStmt(compilation, nullptr);
        }

        events.push_back(&ev);
    }

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    auto result = compilation.emplace<WaitOrderStatement>(events.copy(compilation), ifTrue, ifFalse,
                                                          syntax.sourceRange());
    if (context.flags.has(ASTFlags::Function) || context.flags.has(ASTFlags::Final) ||
        context.inAlwaysCombLatch()) {
        context.addDiag(diag::TimingInFuncNotAllowed, syntax.sourceRange());
        return badStmt(compilation, result);
    }

    return *result;
}